

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureFileCommand.h
# Opt level: O0

void __thiscall cmConfigureFileCommand::cmConfigureFileCommand(cmConfigureFileCommand *this)

{
  cmConfigureFileCommand *this_local;
  
  cmCommand::cmCommand(&this->super_cmCommand);
  (this->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmConfigureFileCommand_00bc0c50;
  cmNewLineStyle::cmNewLineStyle(&this->NewLineStyle);
  std::__cxx11::string::string((string *)&this->InputFile);
  std::__cxx11::string::string((string *)&this->OutputFile);
  return;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmConfigureFileCommand; }